

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md_display_driver.cpp
# Opt level: O3

void __thiscall MdDisplayDriver::display(MdDisplayDriver *this,Document *doc,ostream *output)

{
  undefined4 uVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  undefined7 uVar11;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  ostream *poVar9;
  ulong uVar10;
  char *pcVar12;
  ulong uVar13;
  bool bVar14;
  int local_84;
  long *local_80;
  long local_78;
  long local_70 [2];
  ostream *local_60;
  undefined8 local_58;
  undefined8 local_50;
  long *local_48;
  Document *local_40;
  ulong local_38;
  
  lVar3 = Document::size();
  if (lVar3 != 0) {
    uVar13 = 0;
    local_84 = 1;
    local_60 = output;
    local_40 = doc;
    do {
      local_48 = (long *)Document::operator[]((ulong)doc);
      uVar1 = (**(code **)(*local_48 + 8))();
      local_38 = uVar13;
      switch(uVar1) {
      case 1:
        lVar3 = 2;
        pcVar12 = "# ";
        break;
      case 2:
        lVar3 = 3;
        pcVar12 = "## ";
        break;
      case 3:
        lVar3 = 4;
        pcVar12 = "### ";
        break;
      case 7:
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)output,local_84);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,") ",2);
        local_84 = local_84 + 1;
      case 4:
      case 5:
      case 6:
        goto switchD_00122cdc_default;
      case 8:
        lVar3 = 2;
        pcVar12 = "* ";
        break;
      case 9:
        lVar3 = 4;
        pcVar12 = "  * ";
        break;
      case 10:
        lVar3 = 2;
        pcVar12 = "> ";
        break;
      case 0xb:
        lVar3 = 4;
        pcVar12 = "    ";
        break;
      default:
        goto switchD_00122cdc_default;
      }
      std::__ostream_insert<char,std::char_traits<char>>(output,pcVar12,lVar3);
switchD_00122cdc_default:
      plVar4 = local_48;
      lVar3 = Paragraph::size();
      if (lVar3 != 0) {
        uVar13 = 0;
        do {
          plVar4 = (long *)Paragraph::operator[]((ulong)plVar4);
          uVar11 = (undefined7)((ulong)plVar4 >> 8);
          local_50 = CONCAT71(uVar11,1);
          if (plVar4 == (long *)0x0) {
            local_58 = CONCAT71(uVar11,1);
            lVar3 = 0;
            bVar14 = true;
          }
          else {
            lVar5 = __dynamic_cast(plVar4,&LineElement::typeinfo,&CodeLineElement::typeinfo,0);
            lVar3 = __dynamic_cast(plVar4,&LineElement::typeinfo,&UrlLineElement::typeinfo);
            lVar6 = __dynamic_cast(plVar4,&LineElement::typeinfo,&BoldLineElement::typeinfo);
            lVar7 = __dynamic_cast(plVar4,&LineElement::typeinfo,&ItalicLineElement::typeinfo);
            uVar8 = CONCAT71((int7)((ulong)lVar7 >> 8),lVar7 == 0);
            bVar14 = lVar5 == 0;
            local_58 = uVar8;
            if ((bVar14) ||
               (uVar8 = (**(code **)(*local_48 + 8))(), output = local_60, (int)uVar8 == 0xb)) {
              output = local_60;
              if (lVar3 == 0) {
                if (lVar6 == 0) {
                  if (lVar7 == 0) {
                    local_58 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>(local_60,"*",1);
                    local_58 = 0;
                  }
                  lVar3 = 0;
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>(local_60,"**",2);
                  lVar3 = 0;
                  local_50 = 0;
                }
                goto LAB_00122ecd;
              }
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>(local_60,"[",1);
            }
            else {
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>(local_60,"`",1);
              bVar14 = false;
            }
            local_50 = CONCAT71((int7)((ulong)poVar9 >> 8),lVar6 == 0);
          }
LAB_00122ecd:
          (**(code **)(*plVar4 + 0x10))(&local_80,plVar4);
          std::__ostream_insert<char,std::char_traits<char>>(output,(char *)local_80,local_78);
          if (local_80 != local_70) {
            operator_delete(local_80,local_70[0] + 1);
          }
          plVar4 = local_48;
          if ((bVar14) || (iVar2 = (**(code **)(*local_48 + 8))(local_48), iVar2 == 0xb)) {
            if (lVar3 == 0) {
              if ((char)local_50 == '\0') {
                lVar3 = 2;
                pcVar12 = "**";
              }
              else {
                if ((char)local_58 != '\0') goto LAB_00122ffc;
                lVar3 = 1;
                pcVar12 = "*";
              }
              goto LAB_00122ff7;
            }
            std::__ostream_insert<char,std::char_traits<char>>(output,"](",2);
            UrlLineElement::url_abi_cxx11_();
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (output,(char *)local_80,local_78);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
            if (local_80 != local_70) {
              operator_delete(local_80,local_70[0] + 1);
            }
          }
          else {
            lVar3 = 1;
            pcVar12 = "`";
LAB_00122ff7:
            std::__ostream_insert<char,std::char_traits<char>>(output,pcVar12,lVar3);
          }
LAB_00122ffc:
          uVar13 = uVar13 + 1;
          uVar10 = Paragraph::size();
        } while (uVar13 < uVar10);
      }
      iVar2 = (**(code **)(*plVar4 + 8))(plVar4);
      if (iVar2 != 7) {
        local_84 = 1;
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + (char)output);
      std::ostream::put((char)output);
      plVar4 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      doc = local_40;
      uVar13 = local_38 + 1;
      uVar10 = Document::size();
    } while (uVar13 < uVar10);
  }
  return;
}

Assistant:

void MdDisplayDriver::display(Document * doc, ostream & output) {
	Paragraph *p(nullptr);
	LineElement *l(nullptr);
	CodeLineElement *code_le(nullptr);
	ItalicLineElement *italic_le(nullptr);
	BoldLineElement *bold_le(nullptr);
	UrlLineElement *url_le(nullptr);

	int olist1_index(1);

	for (size_t i(0); i < doc->size(); ++i) {
		p = (*doc)[i];

		switch (p->level()) {
			case Paragraph::Level::Title1:
				output << "# ";
				break;
			case Paragraph::Level::Title2:
				output << "## ";
				break;
			case Paragraph::Level::Title3:
				output << "### ";
				break;
			case Paragraph::Level::UList1:
				output << "* ";
				break;
			case Paragraph::Level::UList2:
				output << "  * ";
				break;
			case Paragraph::Level::OList1:
				output << olist1_index << ") ";
				++olist1_index;
				break;
			case Paragraph::Level::Quote:
				output << "> ";
				break;
			case Paragraph::Level::Code:
				output << "    ";
				break;
			default:
				break;

		}
		for (size_t j(0); j < p->size(); ++j) {
			l = (*p)[j];
			
			code_le = dynamic_cast<CodeLineElement*>(l);
			url_le = dynamic_cast<UrlLineElement*>(l);
			bold_le = dynamic_cast<BoldLineElement*>(l);
			italic_le = dynamic_cast<ItalicLineElement*>(l);
			
			if (code_le and p->level() != Paragraph::Level::Code) {
				output << "`";
			} else if (url_le) {
				output << "[";
			} else if (bold_le) {
				output << "**";
			} else if (italic_le) {
				output << "*";
			}

			output << l->content();
			
			if (code_le and p->level() != Paragraph::Level::Code) {
				output << "`";
			} else if (url_le) {
				output << "](" << url_le->url() << ")";
			} else if (bold_le) {
				output << "**";
			} else if (italic_le) {
				output << "*";
			}
		}

		if (p->level() != Paragraph::Level::OList1) {
			olist1_index = 1;
		}

		output << endl << endl;
	}
}